

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatMap.test.cpp
# Opt level: O1

void __thiscall
CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
CustomType(CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *other)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  int iVar5;
  ostream *poVar6;
  
  paVar1 = &(this->t).field_2;
  (this->t)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (other->t)._M_dataplus._M_p;
  paVar2 = &(other->t).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(other->t).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->t).field_2 + 8) = uVar4;
  }
  else {
    (this->t)._M_dataplus._M_p = pcVar3;
    (this->t).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->t)._M_string_length = (other->t)._M_string_length;
  (other->t)._M_dataplus._M_p = (pointer)paVar2;
  (other->t)._M_string_length = 0;
  (other->t).field_2._M_local_buf[0] = '\0';
  iVar5 = idCounter + 1;
  this->id = idCounter;
  idCounter = iVar5;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"CustomType<",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE",0x34);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,">::CustomType() id",0x12);
  poVar6 = (ostream *)std::ostream::operator<<(&std::cout,this->id);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," move ctor, t=",0xe);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(this->t)._M_dataplus._M_p,(this->t)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  return;
}

Assistant:

CustomType(CustomType&& other) noexcept : t(std::move(other.t)), id(idCounter++) {
        std::cout << "CustomType<" << typeid(T).name() << ">::CustomType() id" << id << " move ctor, t=" << this->t << "\n";
    }